

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::FramebufferGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator=
          (RefCntAutoPtr<Diligent::FramebufferGLImpl> *this,FramebufferGLImpl *pObj)

{
  FramebufferGLImpl *pObj_local;
  RefCntAutoPtr<Diligent::FramebufferGLImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (FramebufferGLImpl *)0x0) {
      DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
      ::Release((DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                 *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (FramebufferGLImpl *)0x0) {
      RefCountedObject<Diligent::IFramebuffer>::AddRef
                ((RefCountedObject<Diligent::IFramebuffer> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }